

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O1

double __thiscall sophia_interface::crossection(sophia_interface *this,double x,int NDIR,int NL0)

{
  runtime_error *this_00;
  long lVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double adStack_220 [12];
  double sig_res [9];
  double dStack_178;
  double SIG0 [9];
  double dStack_128;
  double AMRES [9];
  undefined1 auStack_d8 [8];
  double WIDTH [9];
  double local_60;
  double local_50;
  double s;
  double local_40;
  double local_38;
  double local_28;
  
  if (NL0 - 0xfU < 0xfffffffe) {
    adStack_220[10] = 5.42591291378836e-318;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    adStack_220[10] = 5.42600184560461e-318;
    std::runtime_error::runtime_error(this_00,"crossection: particle ID incorrectly specified.");
    goto LAB_0010c1fb;
  }
  SIG0[5] = 0.0;
  SIG0[6] = 0.0;
  SIG0[3] = 0.0;
  SIG0[4] = 0.0;
  SIG0[1] = 0.0;
  SIG0[2] = 0.0;
  SIG0[0] = 0.0;
  SIG0[7] = 0.0;
  AMRES[7] = 0.0;
  AMRES[5] = 0.0;
  AMRES[6] = 0.0;
  AMRES[3] = 0.0;
  AMRES[4] = 0.0;
  AMRES[1] = 0.0;
  AMRES[2] = 0.0;
  dStack_128 = 0.0;
  AMRES[0] = 0.0;
  WIDTH[7] = 0.0;
  WIDTH[5] = 0.0;
  WIDTH[6] = 0.0;
  WIDTH[3] = 0.0;
  WIDTH[4] = 0.0;
  WIDTH[1] = 0.0;
  WIDTH[2] = 0.0;
  auStack_d8 = (undefined1  [8])0x0;
  WIDTH[0] = 0.0;
  dVar6 = *(double *)(&DAT_0012d5a0 + (ulong)(NL0 == 0xd) * 8);
  if (NL0 == 0xd) {
    pdVar2 = AMRESp;
    pdVar3 = &dStack_128;
    for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
      *pdVar3 = *pdVar2;
      pdVar2 = pdVar2 + 1;
      pdVar3 = pdVar3 + 1;
    }
    pdVar2 = WIDTHp;
    this = (sophia_interface *)auStack_d8;
    for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(double *)this = *pdVar2;
      pdVar2 = pdVar2 + 1;
      this = (sophia_interface *)(this->K[0] + 1);
    }
    lVar1 = 0;
    do {
      SIG0[lVar1 + -1] = RATIOJp[lVar1] * (4.893089117 / dVar6) * BGAMMAp[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 9);
  }
  if (NL0 == 0xe) {
    pdVar2 = AMRESn;
    pdVar3 = &dStack_128;
    for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
      *pdVar3 = *pdVar2;
      pdVar2 = pdVar2 + 1;
      pdVar3 = pdVar3 + 1;
    }
    pdVar2 = WIDTHn;
    this = (sophia_interface *)auStack_d8;
    for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
      *(double *)this = *pdVar2;
      pdVar2 = pdVar2 + 1;
      this = (sophia_interface *)(this->K[0] + 1);
    }
    lVar1 = 0;
    do {
      SIG0[lVar1 + -1] = RATIOJn[lVar1] * (4.893089117 / dVar6) * BGAMMAn[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 9);
  }
  sig_res[5] = 0.0;
  sig_res[6] = 0.0;
  sig_res[3] = 0.0;
  sig_res[4] = 0.0;
  sig_res[1] = 0.0;
  sig_res[2] = 0.0;
  adStack_220[0xb] = 0.0;
  sig_res[0] = 0.0;
  sig_res[7] = 0.0;
  dVar6 = AM[NL0 - 1];
  dVar6 = dVar6 * dVar6 + (dVar6 + dVar6) * x;
  if (dVar6 < 1.1646) {
    return 0.0;
  }
  local_40 = 0.0;
  local_38 = 0.0;
  local_50 = 0.0;
  local_60 = 0.0;
  if (x <= 10.0) {
    dVar7 = x * 1.87654 + 0.8803505929000001;
    dVar4 = (double)auStack_d8 * (double)auStack_d8 * dVar7;
    dVar10 = (dVar7 / x) / x;
    dVar8 = dVar7 - dStack_128 * dStack_128;
    adStack_220[10] = 5.41875884323658e-318;
    local_40 = Ef(this,x,0.152,0.17);
    local_40 = local_40 * ((dVar10 * 0.0 * dVar4) / (dVar8 * dVar8 + dVar4));
    adStack_220[0xb] = local_40;
    lVar1 = 0;
    do {
      dVar8 = WIDTH[lVar1] * WIDTH[lVar1] * dVar7;
      dVar4 = SIG0[lVar1];
      dVar9 = dVar7 - AMRES[lVar1] * AMRES[lVar1];
      adStack_220[10] = 5.41937148463742e-318;
      dVar5 = Ef(this,x,0.15,0.38);
      dVar5 = dVar5 * ((dVar4 * dVar10 * dVar8) / (dVar9 * dVar9 + dVar8));
      sig_res[lVar1] = dVar5;
      local_40 = local_40 + dVar5;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 8);
    if ((x <= 0.1) || (0.6 <= x)) {
      local_50 = 0.0;
      if (0.152 <= x) {
        adStack_220[10] = 5.42121434949641e-318;
        dVar4 = pow((x + -0.152) / 0.098,1.2894736842105265);
        adStack_220[10] = 5.42136750984662e-318;
        dVar7 = pow(x * 4.0,-3.2894736842105265);
        local_50 = dVar7 * dVar4 * 92.7;
      }
    }
    else {
      dVar4 = 0.0;
      if (0.152 <= x) {
        adStack_220[10] = 5.42003847325931e-318;
        dVar4 = pow((x + -0.152) / 0.098,1.2894736842105265);
        adStack_220[10] = 5.42019163360952e-318;
        dVar7 = pow(x * 4.0,-3.2894736842105265);
        dVar4 = dVar7 * dVar4 * 92.7;
      }
      adStack_220[10] = 5.42052759824869e-318;
      dVar7 = exp((-(x + -0.29) * (x + -0.29)) / 0.002);
      adStack_220[10] = 5.42084380026203e-318;
      dVar8 = exp((-(x + -0.37) * (x + -0.37)) / 0.002);
      local_50 = dVar8 * -15.0 + dVar7 * 40.0 + dVar4;
    }
    local_60 = 0.0;
    if (0.4 <= x) {
      adStack_220[10] = 5.42175288105038e-318;
      dVar4 = pow((x + -0.4) / 0.19999999999999996,0.9999999999999996);
      adStack_220[10] = 5.42190604140059e-318;
      dVar7 = pow(x / 0.6,-2.9999999999999996);
      local_60 = dVar7 * dVar4 * 37.7;
    }
    local_38 = local_50 + local_60;
  }
  dVar4 = 0.0;
  if (NL0 - 0xdU < 2) {
    adStack_220[10] = 5.42233093785601e-318;
    dVar8 = Ef(this,x,0.5,0.1);
    dVar7 = *(double *)(&DAT_0012d5b0 + (ulong)(NL0 == 0xd) * 8);
    adStack_220[10] = 5.42250880148852e-318;
    dVar4 = pow(dVar6,-0.34);
    dVar4 = dVar4 * dVar8 * dVar7;
  }
  dVar7 = 0.0;
  if (x <= 0.85) {
    dVar6 = 0.0;
    dVar8 = 0.0;
    dVar10 = 0.0;
  }
  else {
    if (NL0 == 0xd) {
      adStack_220[10] = 5.42287441006644e-318;
      local_28 = pow(dVar6,-0.34);
      adStack_220[10] = 5.42298804516498e-318;
      dVar7 = pow(dVar6,0.095);
      local_28 = local_28 * 29.3;
LAB_0010c00e:
      local_28 = local_28 + dVar7 * 59.3;
    }
    else {
      local_28 = 0.0;
      if (NL0 == 0xe) {
        adStack_220[10] = 5.42334871308645e-318;
        local_28 = pow(dVar6,-0.34);
        adStack_220[10] = 5.42346234818499e-318;
        dVar7 = pow(dVar6,0.095);
        local_28 = local_28 * 26.4;
        goto LAB_0010c00e;
      }
    }
    adStack_220[10] = 5.42369949969499e-318;
    dVar7 = exp((x + -0.85) / -0.69);
    local_28 = (1.0 - dVar7) * local_28;
    dVar8 = local_28 * 0.89;
    adStack_220[10] = 5.42402064236479e-318;
    dVar7 = pow(x + -0.85,0.75);
    adStack_220[10] = 5.42413427746333e-318;
    dVar10 = pow(x,-0.44);
    adStack_220[10] = 5.42424791256188e-318;
    dVar6 = pow(dVar6,0.08);
    adStack_220[10] = 5.42448506407188e-318;
    dVar7 = exp(dVar7 / -0.64);
    dVar7 = (1.0 - dVar7) * 0.96 * (dVar10 * 74.1 + dVar6 * 62.0);
    dVar6 = dVar7 * 0.14;
    dVar7 = dVar7 * 0.013 + dVar6;
    dVar10 = dVar4 - (local_28 * -0.11 + dVar7);
    dVar4 = 0.0;
    if (0.0 <= dVar10) {
      dVar4 = dVar10;
    }
    dVar10 = (double)(~-(ulong)(dVar10 < 0.0) & (ulong)dVar8 |
                     (ulong)(dVar8 + dVar10) & -(ulong)(dVar10 < 0.0));
    dVar8 = dVar10 + dVar7;
  }
  switch(NDIR) {
  case 0:
    local_40 = local_40 + local_38 + dVar7;
    goto LAB_0010c1a7;
  case 1:
    break;
  case 2:
    dVar4 = local_38;
    goto LAB_0010c1a7;
  case 3:
    local_40 = local_40 + local_38 + dVar8;
LAB_0010c1a7:
    return dVar4 + local_40;
  case 4:
    return local_38;
  case 5:
    return dVar10;
  case 6:
    local_40 = local_40 + local_60;
    break;
  case 7:
    local_40 = local_40 + local_50;
    break;
  case 8:
    local_40 = local_40 + local_38 + dVar6;
    break;
  case 9:
    local_40 = local_40 + local_38 + dVar7;
    break;
  case 10:
    return dVar7;
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
    return adStack_220[NDIR];
  default:
    adStack_220[10] = 5.42615994661128e-318;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    adStack_220[10] = 5.42624887842753e-318;
    std::runtime_error::runtime_error(this_00,"wrong input NDIR in crossection.f !");
LAB_0010c1fb:
    adStack_220[10] = 5.4261105400467e-318;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_40;
}

Assistant:

double sophia_interface::crossection(double x, int NDIR, int NL0) {
// calculates crossection of Nucleon-gamma-interaction
// (see thesis of J.Rachen, p.45ff and corrections
// report from 27/04/98, 5/05/98, 22/05/98 of J.Rachen)
// ** Date: 20/01/98   **
// ** correct.:27/04/98**
// ** update: 23/05/98 **
// ** author: A.Muecke **

    if (NL0 != 13 && NL0 != 14) throw std::runtime_error("crossection: particle ID incorrectly specified.");
    const double AM2 = (NL0 == 13)? 0.880351 : 0.882792;  // used to be array AM2[49]. Only these two values of it are ever used.
    double SIG0[9] = {0.};
    double AMRES[9] = {0.};
    double WIDTH[9] = {0.};

    if (NL0 == 13) {
        for (int i = 0; i < 9; ++i) {
            SIG0[i] = 4.893089117 / AM2 * RATIOJp[i] * BGAMMAp[i];
            AMRES[i] = AMRESp[i];
            WIDTH[i] = WIDTHp[i];
        }
    }

    if (NL0 == 14) {
        for (int i = 0; i < 9; ++i) {
            SIG0[i] = 4.893089117 / AM2 * RATIOJn[i] * BGAMMAn[i];
            AMRES[i] = AMRESn[i];
            WIDTH[i] = WIDTHn[i];
        }
    }

    double sig_res[9] = {0.};

    const double sth = 1.1646;
    const double pm = AM[NL0 - 1];
    const double s = pm * pm + 2. * pm * x;
    if (s < sth) {
        return 0.;
    }
    double cross_res = 0.;
    double cross_dir = 0.;
    double cross_dir1 = 0.;
    double cross_dir2 = 0.;
    if (x <= 10.) {
        // RESONANCES:
        cross_res = breitwigner(SIG0[0], WIDTH[0], AMRES[0], x) * Ef(x, 0.152, 0.17);
        sig_res[0] = cross_res;

        for (int Ni = 1; Ni < 9; ++Ni) {
            sig_res[Ni] = breitwigner(SIG0[Ni], WIDTH[Ni], AMRES[Ni], x) * Ef(x, 0.15, 0.38);
            cross_res += sig_res[Ni];
        }
        // DIRECT CHANNEL:
        if (x > 0.1 && x < 0.6) {
            cross_dir1 = singleback(x) + 40. * std::exp(-(x - 0.29) * (x - 0.29) / 0.002) - 15. * std::exp(-(x - 0.37) * (x - 0.37) / 0.002);
        } else {
            cross_dir1 = singleback(x);
        }
        cross_dir2 = twoback(x);
        cross_dir = cross_dir1 + cross_dir2;
    }

    // FRAGMENTATION 2:
    double cross_frag2 = 0.;
    if (NL0 == 13) {
          cross_frag2 = 80.3 * Ef(x, 0.5, 0.1) * std::pow(s, -0.34);
    } else if (NL0 == 14) {
          cross_frag2 = 60.2 * Ef(x, 0.5, 0.1) * std::pow(s, -0.34);
    }

    // MULTIPION PRODUCTION/FRAGMENTATION 1 CROSS SECTION
    double cross_diffr = 0.;
    double cross_diffr1 = 0.;
    double cross_diffr2 = 0.;
    double cs_multidiff = 0.;
    double cs_multi = 0.;
    if (x > 0.85) {
        double ss1 = (x - .85) / .69;
        double ss2 = 0.;
        if (NL0 == 13) {
            ss2 = 29.3 * std::pow(s, -.34) + 59.3 * std::pow(s, .095);
        } else if (NL0 == 14) {
            ss2 = 26.4 * std::pow(s, -.34) + 59.3 * std::pow(s, .095);
        }
        cs_multidiff = (1. - std::exp(-ss1)) * ss2;
        cs_multi = 0.89 * cs_multidiff;

        // DIFFRACTIVE SCATTERING:
        cross_diffr1 = .099 * cs_multidiff;
        cross_diffr2 = .011 * cs_multidiff;
        cross_diffr = 0.11 * cs_multidiff;

        ss1 = std::pow((x - .85), .75) / .64;
        ss2 = 74.1 * std::pow(x, -.44) + 62. * std::pow(s, .08);
        double cs_tmp = 0.96 * (1. - std::exp(-ss1)) * ss2;
        cross_diffr1 = 0.14 * cs_tmp;
        cross_diffr2 = 0.013 * cs_tmp;
        double cs_delta = cross_frag2 - (cross_diffr1 + cross_diffr2 - cross_diffr);
        if (cs_delta < 0.) {
            cross_frag2 = 0.;
            cs_multi += cs_delta;
        } else {
            cross_frag2 = cs_delta;
        }
        cross_diffr = cross_diffr1 + cross_diffr2;
        cs_multidiff = cs_multi + cross_diffr;
    }

    double xSection = 0.;
    switch (NDIR) {
        case 0:
            xSection = cross_res + cross_dir + cross_diffr + cross_frag2;
            break;
        case 1:
            xSection = cross_res;
            break;
        case 2:
            xSection = cross_res + cross_dir;
            break;
        case 3:
            xSection = cross_res + cross_dir + cs_multidiff + cross_frag2;
            break;
        case 4:
            xSection = cross_dir;
            break;
        case 5:
            xSection = cs_multi;
            break;
        case 6:
            xSection = cross_res + cross_dir2;
            break;
        case 7:
            xSection = cross_res + cross_dir1;
            break;
        case 8:
            xSection = cross_res + cross_dir + cross_diffr1;
            break;
        case 9:
            xSection = cross_res + cross_dir + cross_diffr;
            break;
        case 10:
            xSection = cross_diffr;
            break;
        case 11:
        case 12:
        case 13:
        case 14:
        case 15:
        case 16:
        case 17:
        case 18:
        case 19:
            xSection = sig_res[NDIR - 11];
            break;
        default:
            throw std::runtime_error("wrong input NDIR in crossection.f !");
    }
    return xSection;
}